

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int automataTest(char *filename,char *result,char *err,int options)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  FILE *__s;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  byte bVar12;
  int iVar13;
  long lVar14;
  char *extraout_RDX;
  char *pcVar15;
  char *pcVar16;
  long lVar17;
  int iVar18;
  char expr [5000];
  xmlAutomataStatePtr states [1000];
  char acStack_3770 [499];
  undefined1 uStack_357d;
  char acStack_3570 [512];
  char *pcStack_3370;
  char *pcStack_3368;
  long local_3348;
  long local_3340;
  long local_3320;
  undefined8 local_3310;
  char local_3308 [5008];
  long local_1f78 [1001];
  
  nb_tests = nb_tests + 1;
  memset(local_1f78,0,8000);
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puVar11 = (undefined8 *)__xmlGenericError();
    pcVar1 = (code *)*puVar11;
    puVar11 = (undefined8 *)__xmlGenericErrorContext();
    (*pcVar1)(*puVar11,"Cannot open %s for reading\n",filename);
  }
  else {
    pcVar16 = "";
    pcVar6 = filename;
    pcVar5 = resultFilename(filename,"",".res");
    if (pcVar5 == (char *)0x0) {
      automataTest_cold_2();
      pcStack_3370 = filename;
      pcStack_3368 = result;
      pcVar5 = baseFilename(pcVar6);
      pcVar6 = ".tmp";
      if (extraout_RDX != (char *)0x0) {
        pcVar6 = extraout_RDX;
      }
      pcVar15 = "";
      if (pcVar16 != (char *)0x0) {
        pcVar15 = pcVar16;
      }
      strncpy(acStack_3570,pcVar6,499);
      iVar4 = snprintf(acStack_3770,499,"%s%s%s",pcVar15,pcVar5,acStack_3570);
      if (0x1f2 < iVar4) {
        uStack_357d = 0;
      }
      pcVar6 = strdup(acStack_3770);
      return (int)pcVar6;
    }
    __s = fopen64(pcVar5,"wb");
    if (__s == (FILE *)0x0) {
      automataTest_cold_1();
    }
    else {
      local_3348 = xmlNewAutomata();
      if (local_3348 == 0) {
        puVar11 = (undefined8 *)__xmlGenericError();
        pcVar1 = (code *)*puVar11;
        puVar11 = (undefined8 *)__xmlGenericErrorContext();
        (*pcVar1)(*puVar11,"Cannot create automata\n");
      }
      else {
        local_1f78[0] = xmlAutomataGetInitState(local_3348);
        if (local_1f78[0] != 0) {
          local_3320 = 0;
LAB_0010a501:
          local_3340 = 0;
LAB_0010a50a:
          iVar4 = 0;
LAB_0010a513:
          do {
            pcVar6 = fgets(local_3308,0x1194,__stream);
            cVar3 = local_3308[0];
            if (pcVar6 == (char *)0x0) {
LAB_0010abe8:
              fclose(__s);
              fclose(__stream);
              if (local_3340 != 0) {
                xmlRegFreeRegexp(local_3340);
              }
              if (local_3320 != 0) {
                xmlRegFreeExecCtxt();
              }
              if (local_3348 != 0) {
                xmlFreeAutomata(local_3348);
              }
              iVar4 = compareFiles(pcVar5,result);
              if (iVar4 != 0) {
                fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
              }
              unlink(pcVar5);
              free(pcVar5);
              return (uint)(iVar4 != 0);
            }
          } while (local_3308[0] == '#');
          sVar7 = strlen(local_3308);
          if ((int)(uint)sVar7 < 1) {
LAB_0010a566:
            local_3308[(int)sVar7] = '\0';
            goto LAB_0010a513;
          }
          uVar8 = (ulong)((uint)sVar7 & 0x7fffffff);
          while (((ulong)(byte)local_3308[uVar8 - 1] < 0x21 &&
                 ((0x100002600U >> ((ulong)(byte)local_3308[uVar8 - 1] & 0x3f) & 1) != 0))) {
            sVar7 = uVar8 - 1;
            bVar2 = uVar8 < 2;
            uVar8 = sVar7;
            if (bVar2) goto LAB_0010a566;
          }
          local_3308[uVar8 & 0xffffffff] = '\0';
          bVar12 = local_3308[1] ^ 0x20;
          if ((cVar3 == 't' && bVar12 == 0) && local_3348 != 0) {
            if ((byte)(local_3308[2] - 0x30U) < 10) {
              iVar13 = 0;
              pcVar6 = local_3308 + 2;
              cVar3 = local_3308[2];
              do {
                iVar13 = (uint)(byte)(cVar3 - 0x30) + iVar13 * 10;
                cVar3 = pcVar6[1];
                pcVar6 = pcVar6 + 1;
              } while ((byte)(cVar3 - 0x30U) < 10);
              lVar17 = (long)iVar13;
            }
            else {
              lVar17 = 0;
              pcVar6 = local_3308 + 2;
              cVar3 = local_3308[2];
            }
            if (cVar3 == ' ') {
              lVar9 = local_1f78[lVar17];
              if (lVar9 == 0) {
                lVar9 = xmlAutomataNewState(local_3348);
                local_1f78[lVar17] = lVar9;
              }
              cVar3 = pcVar6[1];
              if ((byte)(cVar3 - 0x30U) < 10) {
                iVar13 = 0;
                do {
                  iVar13 = (uint)(byte)(cVar3 - 0x30) + iVar13 * 10;
                  cVar3 = pcVar6[2];
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar3 - 0x30U) < 10);
                lVar14 = (long)iVar13;
              }
              else {
                lVar14 = 0;
              }
              if (cVar3 == ' ') {
                lVar10 = local_1f78[lVar14];
                if (lVar10 == 0) {
                  local_3310 = lVar14;
                  lVar10 = xmlAutomataNewState(local_3348);
                  local_1f78[local_3310] = lVar10;
                  lVar9 = local_1f78[lVar17];
                }
                xmlAutomataNewTransition(local_3348,lVar9,lVar10,pcVar6 + 2);
                goto LAB_0010a513;
              }
            }
          }
          else {
            if ((cVar3 == 'e' && bVar12 == 0) && local_3348 != 0) {
              if ((byte)(local_3308[2] - 0x30U) < 10) {
                iVar13 = 0;
                pcVar6 = local_3308 + 2;
                cVar3 = local_3308[2];
                do {
                  iVar13 = (uint)(byte)(cVar3 - 0x30) + iVar13 * 10;
                  cVar3 = pcVar6[1];
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar3 - 0x30U) < 10);
                lVar17 = (long)iVar13;
              }
              else {
                lVar17 = 0;
                pcVar6 = local_3308 + 2;
                cVar3 = local_3308[2];
              }
              if (cVar3 != ' ') goto LAB_0010abb3;
              lVar9 = local_1f78[lVar17];
              if (lVar9 == 0) {
                lVar9 = xmlAutomataNewState(local_3348);
                local_1f78[lVar17] = lVar9;
              }
              cVar3 = pcVar6[1];
              if ((byte)(cVar3 - 0x30U) < 10) {
                pcVar6 = pcVar6 + 2;
                iVar13 = 0;
                do {
                  iVar13 = (uint)(byte)(cVar3 - 0x30) + iVar13 * 10;
                  cVar3 = *pcVar6;
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar3 - 0x30U) < 10);
                lVar14 = (long)iVar13;
              }
              else {
                lVar14 = 0;
              }
              lVar10 = local_1f78[lVar14];
              if (lVar10 == 0) {
                lVar10 = xmlAutomataNewState(local_3348,lVar9);
                local_1f78[lVar14] = lVar10;
                lVar9 = local_1f78[lVar17];
              }
              xmlAutomataNewEpsilon(local_3348,lVar9,lVar10);
              goto LAB_0010a513;
            }
            if ((cVar3 == 'f' && bVar12 == 0) && local_3348 != 0) {
              iVar13 = 0;
              if ((byte)(local_3308[2] - 0x30U) < 10) {
                iVar13 = 0;
                pcVar6 = local_3308 + 3;
                cVar3 = local_3308[2];
                do {
                  iVar13 = (uint)(byte)(cVar3 - 0x30) + iVar13 * 10;
                  cVar3 = *pcVar6;
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar3 - 0x30U) < 10);
              }
              if (local_1f78[iVar13] == 0) {
                puVar11 = (undefined8 *)__xmlGenericError();
                pcVar1 = (code *)*puVar11;
                puVar11 = (undefined8 *)__xmlGenericErrorContext();
                (*pcVar1)(*puVar11,"Bad state %d : %s\n",iVar13,local_3308);
                goto LAB_0010abe8;
              }
              xmlAutomataSetFinalState(local_3348);
              goto LAB_0010a513;
            }
            if ((cVar3 != 'c' || bVar12 != 0) || local_3348 == 0) {
              if ((local_3308[1] == 0x2d && cVar3 == '-') && local_3348 != 0) {
                local_3340 = xmlAutomataCompile();
                xmlFreeAutomata(local_3348);
                local_3348 = 0;
                if (local_3340 != 0) goto LAB_0010a513;
                puVar11 = (undefined8 *)__xmlGenericError();
                pcVar1 = (code *)*puVar11;
                puVar11 = (undefined8 *)__xmlGenericErrorContext();
                local_3340 = 0;
                (*pcVar1)(*puVar11,"Failed to compile the automata");
                local_3348 = 0;
                goto LAB_0010abe8;
              }
              if (local_3308[1] != 0x3e || cVar3 != '=') {
                if (local_3340 == 0) {
                  puVar11 = (undefined8 *)__xmlGenericError();
                  pcVar1 = (code *)*puVar11;
                  puVar11 = (undefined8 *)__xmlGenericErrorContext();
                  (*pcVar1)(*puVar11,"Unexpected line %s\n",local_3308);
                  local_3340 = 0;
                }
                else {
                  if (local_3320 == 0) {
                    local_3320 = xmlRegNewExecCtxt(local_3340,0,0);
                  }
                  iVar4 = xmlRegExecPushString(local_3320,local_3308,0);
                }
                goto LAB_0010a513;
              }
              if (local_3340 == 0) {
                fwrite("=> failed not compiled\n",0x17,1,__s);
                goto LAB_0010a501;
              }
              if (local_3320 == 0) {
                local_3320 = xmlRegNewExecCtxt(local_3340,0,0);
              }
              if (iVar4 == 0) {
                iVar4 = xmlRegExecPushString(local_3320,0,0);
              }
              if (iVar4 == 1) {
                pcVar6 = "=> Passed\n";
LAB_0010aada:
                sVar7 = 10;
LAB_0010aadd:
                fwrite(pcVar6,sVar7,1,__s);
              }
              else {
                if (iVar4 + 1U < 2) {
                  pcVar6 = "=> Failed\n";
                  goto LAB_0010aada;
                }
                if (iVar4 < 0) {
                  sVar7 = 9;
                  pcVar6 = "=> Error\n";
                  goto LAB_0010aadd;
                }
              }
              xmlRegFreeExecCtxt(local_3320);
              local_3320 = 0;
              goto LAB_0010a50a;
            }
            if ((byte)(local_3308[2] - 0x30U) < 10) {
              iVar13 = 0;
              pcVar6 = local_3308 + 2;
              cVar3 = local_3308[2];
              do {
                iVar13 = (uint)(byte)(cVar3 - 0x30) + iVar13 * 10;
                cVar3 = pcVar6[1];
                pcVar6 = pcVar6 + 1;
              } while ((byte)(cVar3 - 0x30U) < 10);
              lVar17 = (long)iVar13;
            }
            else {
              lVar17 = 0;
              pcVar6 = local_3308 + 2;
              cVar3 = local_3308[2];
            }
            if (cVar3 == ' ') {
              if (local_1f78[lVar17] == 0) {
                lVar9 = xmlAutomataNewState(local_3348);
                local_1f78[lVar17] = lVar9;
              }
              cVar3 = pcVar6[1];
              if ((byte)(cVar3 - 0x30U) < 10) {
                iVar13 = 0;
                do {
                  iVar13 = (uint)(byte)(cVar3 - 0x30) + iVar13 * 10;
                  cVar3 = pcVar6[2];
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar3 - 0x30U) < 10);
                lVar9 = (long)iVar13;
              }
              else {
                lVar9 = 0;
              }
              if (cVar3 != ' ') goto LAB_0010abb3;
              lVar14 = local_1f78[lVar9];
              if (lVar14 == 0) {
                local_3310 = lVar9;
                lVar14 = xmlAutomataNewState(local_3348);
                local_1f78[local_3310] = lVar14;
              }
              cVar3 = pcVar6[2];
              pcVar6 = pcVar6 + 2;
              iVar13 = 0;
              if ((byte)(cVar3 - 0x30U) < 10) {
                iVar13 = 0;
                do {
                  iVar13 = (uint)(byte)(cVar3 - 0x30) + iVar13 * 10;
                  cVar3 = pcVar6[1];
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar3 - 0x30U) < 10);
              }
              if (cVar3 != ' ') goto LAB_0010abb3;
              cVar3 = pcVar6[1];
              iVar18 = 0;
              if ((byte)(cVar3 - 0x30U) < 10) {
                iVar18 = 0;
                do {
                  iVar18 = (uint)(byte)(cVar3 - 0x30) + iVar18 * 10;
                  cVar3 = pcVar6[2];
                  pcVar6 = pcVar6 + 1;
                } while ((byte)(cVar3 - 0x30U) < 10);
              }
              if (cVar3 == ' ') {
                xmlAutomataNewCountTrans
                          (local_3348,local_1f78[lVar17],lVar14,pcVar6 + 2,iVar13,iVar18);
                goto LAB_0010a513;
              }
            }
          }
LAB_0010abb3:
          puVar11 = (undefined8 *)__xmlGenericError();
          pcVar1 = (code *)*puVar11;
          puVar11 = (undefined8 *)__xmlGenericErrorContext();
          (*pcVar1)(*puVar11,"Bad line %s\n",local_3308);
          goto LAB_0010abe8;
        }
        puVar11 = (undefined8 *)__xmlGenericError();
        pcVar1 = (code *)*puVar11;
        puVar11 = (undefined8 *)__xmlGenericErrorContext();
        (*pcVar1)(*puVar11,"Cannot get start state\n");
        xmlFreeAutomata(local_3348);
      }
      fclose(__stream);
    }
  }
  return -1;
}

Assistant:

static int
automataTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED, int options ATTRIBUTE_UNUSED) {
    FILE *input, *output;
    char *temp;
    char expr[5000];
    int len;
    int ret;
    int i;
    int res = 0;
    xmlAutomataPtr am;
    xmlAutomataStatePtr states[1000];
    xmlRegexpPtr regexp = NULL;
    xmlRegExecCtxtPtr exec = NULL;

    nb_tests++;

    for (i = 0;i<1000;i++)
	states[i] = NULL;

    input = fopen(filename, "rb");
    if (input == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot open %s for reading\n", filename);
	return(-1);
    }
    temp = resultFilename(filename, "", ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    output = fopen(temp, "wb");
    if (output == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    am = xmlNewAutomata();
    if (am == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot create automata\n");
	fclose(input);
	return(-1);
    }
    states[0] = xmlAutomataGetInitState(am);
    if (states[0] == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot get start state\n");
	xmlFreeAutomata(am);
	fclose(input);
	return(-1);
    }
    ret = 0;

    while (fgets(expr, 4500, input) != NULL) {
	if (expr[0] == '#')
	    continue;
	len = strlen(expr);
	len--;
	while ((len >= 0) &&
	       ((expr[len] == '\n') || (expr[len] == '\t') ||
		(expr[len] == '\r') || (expr[len] == ' '))) len--;
	expr[len + 1] = 0;
	if (len >= 0) {
	    if ((am != NULL) && (expr[0] == 't') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		xmlAutomataNewTransition(am, states[from], states[to],
			                 BAD_CAST ptr, NULL);
	    } else if ((am != NULL) && (expr[0] == 'e') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		xmlAutomataNewEpsilon(am, states[from], states[to]);
	    } else if ((am != NULL) && (expr[0] == 'f') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int state;

		state = scanNumber(&ptr);
		if (states[state] == NULL) {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad state %d : %s\n", state, expr);
		    break;
		}
		xmlAutomataSetFinalState(am, states[state]);
	    } else if ((am != NULL) && (expr[0] == 'c') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;
		int min, max;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		min = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		max = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		xmlAutomataNewCountTrans(am, states[from], states[to],
			                 BAD_CAST ptr, min, max, NULL);
	    } else if ((am != NULL) && (expr[0] == '-') && (expr[1] == '-')) {
		/* end of the automata */
		regexp = xmlAutomataCompile(am);
		xmlFreeAutomata(am);
		am = NULL;
		if (regexp == NULL) {
		    xmlGenericError(xmlGenericErrorContext,
			    "Failed to compile the automata");
		    break;
		}
	    } else if ((expr[0] == '=') && (expr[1] == '>')) {
		if (regexp == NULL) {
		    fprintf(output, "=> failed not compiled\n");
		} else {
		    if (exec == NULL)
			exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		    if (ret == 0) {
			ret = xmlRegExecPushString(exec, NULL, NULL);
		    }
		    if (ret == 1)
			fprintf(output, "=> Passed\n");
		    else if ((ret == 0) || (ret == -1))
			fprintf(output, "=> Failed\n");
		    else if (ret < 0)
			fprintf(output, "=> Error\n");
		    xmlRegFreeExecCtxt(exec);
		    exec = NULL;
		}
		ret = 0;
	    } else if (regexp != NULL) {
		if (exec == NULL)
		    exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		ret = xmlRegExecPushString(exec, BAD_CAST expr, NULL);
	    } else {
		xmlGenericError(xmlGenericErrorContext,
			"Unexpected line %s\n", expr);
	    }
	}
    }
    fclose(output);
    fclose(input);
    if (regexp != NULL)
	xmlRegFreeRegexp(regexp);
    if (exec != NULL)
	xmlRegFreeExecCtxt(exec);
    if (am != NULL)
	xmlFreeAutomata(am);

    ret = compareFiles(temp, result);
    if (ret) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        res = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(res);
}